

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void finishbinexpval(FuncState *fs,expdesc *e1,expdesc *e2,OpCode op,int v2,int flip,int line,
                    OpCode mmop,TMS event)

{
  int A;
  int iVar1;
  
  A = luaK_exp2anyreg(fs,e1);
  iVar1 = luaK_code(fs,v2 << 0x18 | op | A << 0x10);
  freeexps(fs,e1,e2);
  (e1->u).info = iVar1;
  e1->k = VRELOC;
  luaK_fixline(fs,line);
  luaK_codeABCk(fs,mmop,A,v2,event,flip);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void finishbinexpval (FuncState *fs, expdesc *e1, expdesc *e2,
                             OpCode op, int v2, int flip, int line,
                             OpCode mmop, TMS event) {
  int v1 = luaK_exp2anyreg(fs, e1);
  int pc = luaK_codeABCk(fs, op, 0, v1, v2, 0);
  freeexps(fs, e1, e2);
  e1->u.info = pc;
  e1->k = VRELOC;  /* all those operations are relocatable */
  luaK_fixline(fs, line);
  luaK_codeABCk(fs, mmop, v1, v2, cast_int(event), flip);  /* metamethod */
  luaK_fixline(fs, line);
}